

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O3

shared_ptr<const_CBlock> __thiscall
validation_block_tests::MinerTestingSetup::GoodBlock(MinerTestingSetup *this,uint256 *prev_hash)

{
  TestingSetup *pTVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<CBlock> sVar3;
  shared_ptr<const_CBlock> sVar4;
  undefined1 auStack_48 [16];
  atomic<bool> local_38;
  undefined3 uStack_37;
  TokenPipeEnd TStack_34;
  TokenPipeEnd TStack_30;
  undefined4 uStack_2c;
  _Head_base<0UL,_ECC_Context_*,_false> local_20;
  
  local_20._M_head_impl = *(ECC_Context **)(in_FS_OFFSET + 0x28);
  Block((MinerTestingSetup *)auStack_48,prev_hash);
  sVar3.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
  sVar3.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)prev_hash;
  sVar3 = FinalizeBlock((MinerTestingSetup *)&stack0xffffffffffffffc8,sVar3);
  _Var2 = sVar3.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  pTVar1 = &(this->super_RegTestingSetup).super_TestingSetup;
  (pTVar1->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_flag =
       (atomic<bool>)local_38._M_base._M_i;
  *(undefined3 *)&(pTVar1->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.field_0x1 =
       uStack_37;
  (this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
  m_interrupt.m_pipe_r.m_fd = TStack_34.m_fd;
  (this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
  m_interrupt.m_pipe_w.m_fd = TStack_30.m_fd;
  *(undefined4 *)
   &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup
    .field_0xc = uStack_2c;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48._8_8_);
    _Var2._M_pi = extraout_RDX;
  }
  if ((ECC_Context *)
      ((_Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_> *)(in_FS_OFFSET + 0x28))
      ->super__Head_base<0UL,_ECC_Context_*,_false> == local_20._M_head_impl) {
    sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<const_CBlock>)
           sVar4.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CBlock> MinerTestingSetup::GoodBlock(const uint256& prev_hash)
{
    return FinalizeBlock(Block(prev_hash));
}